

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_midiplay.hpp
# Opt level: O2

Phys * __thiscall OPNMIDIplay::MIDIchannel::NoteInfo::phys_find(NoteInfo *this,uint chip_chan)

{
  Phys *pPVar1;
  uint i;
  ulong uVar2;
  Phys *pPVar3;
  
  pPVar3 = this->chip_channels;
  uVar2 = 0;
  pPVar1 = (Phys *)0x0;
  while ((uVar2 < this->chip_channels_count && (pPVar1 == (Phys *)0x0))) {
    pPVar1 = (Phys *)0x0;
    if (pPVar3->chip_chan == chip_chan) {
      pPVar1 = pPVar3;
    }
    uVar2 = uVar2 + 1;
    pPVar3 = pPVar3 + 1;
  }
  return pPVar1;
}

Assistant:

Phys *phys_find(unsigned chip_chan)
            {
                Phys *ph = NULL;
                for(unsigned i = 0; i < chip_channels_count && !ph; ++i)
                    if(chip_channels[i].chip_chan == chip_chan)
                        ph = &chip_channels[i];
                return ph;
            }